

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

int duckdb_brotli::BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transform_idx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int suffix_len;
  int step_1;
  uint8_t *shift;
  uint16_t local_res18;
  uint16_t param;
  int step;
  uint8_t *uppercase;
  int skip;
  int i;
  int t;
  int prefix_len;
  uint8_t *suffix;
  uint8_t type;
  uint8_t *prefix;
  int idx;
  uint local_70;
  uint8_t *local_68;
  uint8_t *local_58;
  int local_4c;
  uint local_44;
  byte *local_40;
  byte *local_30;
  int local_28;
  int local_14;
  long local_10;
  
  local_28 = 0;
  local_30 = (byte *)(*(long *)(in_RCX + 8) +
                     (ulong)*(ushort *)
                             (*(long *)(in_RCX + 0x10) +
                             (ulong)*(byte *)(*(long *)(in_RCX + 0x20) + (long)(in_R8D * 3)) * 2));
  bVar1 = *(byte *)(*(long *)(in_RCX + 0x20) + (long)(in_R8D * 3 + 1));
  local_40 = (byte *)(*(long *)(in_RCX + 8) +
                     (ulong)*(ushort *)
                             (*(long *)(in_RCX + 0x10) +
                             (ulong)*(byte *)(*(long *)(in_RCX + 0x20) + (long)(in_R8D * 3 + 2)) * 2
                             ));
  local_44 = (uint)*local_30;
  while( true ) {
    local_30 = local_30 + 1;
    if (local_44 == 0) break;
    *(byte *)(in_RDI + local_28) = *local_30;
    local_44 = local_44 - 1;
    local_28 = local_28 + 1;
  }
  uVar3 = (uint)bVar1;
  local_4c = 0;
  local_10 = in_RSI;
  if (uVar3 < 10) {
    local_14 = in_EDX - uVar3;
  }
  else {
    local_14 = in_EDX;
    if ((0xb < uVar3) && (uVar3 < 0x15)) {
      local_10 = in_RSI + (int)(uVar3 - 0xb);
      local_14 = in_EDX - (uVar3 - 0xb);
    }
  }
  while (local_4c < local_14) {
    *(undefined1 *)(in_RDI + local_28) = *(undefined1 *)(local_10 + local_4c);
    local_4c = local_4c + 1;
    local_28 = local_28 + 1;
  }
  if (uVar3 == 10) {
    ToUpperCase((uint8_t *)(in_RDI + (local_28 - local_14)));
  }
  else if (uVar3 == 0xb) {
    local_58 = (uint8_t *)(in_RDI + (local_28 - local_14));
    for (; 0 < local_14; local_14 = local_14 - iVar4) {
      iVar4 = ToUpperCase(local_58);
      local_58 = local_58 + iVar4;
    }
  }
  else if (uVar3 == 0x15) {
    Shift((uint8_t *)(in_RDI + (local_28 - local_14)),local_14,
          (ushort)*(byte *)(*(long *)(in_RCX + 0x28) + (long)(in_R8D << 1)) +
          (ushort)*(byte *)(*(long *)(in_RCX + 0x28) + (long)(in_R8D * 2 + 1)) * 0x100);
  }
  else if (uVar3 == 0x16) {
    bVar1 = *(byte *)(*(long *)(in_RCX + 0x28) + (long)(in_R8D << 1));
    bVar2 = *(byte *)(*(long *)(in_RCX + 0x28) + (long)(in_R8D * 2 + 1));
    local_68 = (uint8_t *)(in_RDI + (local_28 - local_14));
    for (; 0 < local_14; local_14 = local_14 - iVar4) {
      iVar4 = Shift(local_68,local_14,(ushort)bVar1 + (ushort)bVar2 * 0x100);
      local_68 = local_68 + iVar4;
    }
  }
  local_70 = (uint)*local_40;
  while( true ) {
    local_40 = local_40 + 1;
    if (local_70 == 0) break;
    *(byte *)(in_RDI + local_28) = *local_40;
    local_70 = local_70 - 1;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int duckdb_brotli::BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* transforms, int transform_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transform_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transform_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transform_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    } else if (t == BROTLI_TRANSFORM_SHIFT_FIRST) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      Shift(&dst[idx - len], len, param);
    } else if (t == BROTLI_TRANSFORM_SHIFT_ALL) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      uint8_t* shift = &dst[idx - len];
      while (len > 0) {
        int step = Shift(shift, len, param);
        shift += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}